

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O1

bc_slist_t * blogc_template_parse(char *src,size_t src_len,bc_error_t **err)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  _Bool _Var8;
  char *pcVar9;
  bc_error_t *pbVar10;
  ulong current;
  char *pcVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  int local_bc;
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  bc_slist_t *local_90;
  int *local_80;
  ulong local_78;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  undefined8 local_40;
  
  if (err == (bc_error_t **)0x0) {
    return (bc_slist_t *)0x0;
  }
  if (*err != (bc_error_t *)0x0) {
    return (bc_slist_t *)0x0;
  }
  local_bc = 0xb;
  uVar14 = 1;
  current = 0;
  local_b8 = 0;
  local_a8 = 0;
  local_68 = 0;
  local_70 = 0;
  local_60 = 0;
  local_78 = 0;
  local_98 = 0;
  local_58 = 0;
  bVar2 = false;
  bVar5 = false;
  bVar6 = false;
  local_90 = (bc_slist_t *)0x0;
  local_80 = (int *)0x0;
  bVar3 = false;
  local_40 = 0;
  bVar4 = false;
  do {
    if (src_len <= current) break;
    if (uVar14 - 1 < 0x16) {
      cVar1 = src[current];
      iVar12 = (int)cVar1;
      uVar7 = local_a8;
      switch(uVar14) {
      case 1:
        if ((1 - src_len) + current == 0) {
          local_80 = (int *)bc_malloc(0x20);
          *local_80 = local_bc;
          pcVar11 = bc_strndup(src + local_b8,src_len - local_b8);
          if (bVar3) {
            pcVar9 = bc_str_lstrip(pcVar11);
            pcVar9 = bc_strdup(pcVar9);
            *(char **)(local_80 + 2) = pcVar9;
            free(pcVar11);
            bVar3 = false;
          }
          else {
            *(char **)(local_80 + 2) = pcVar11;
          }
          local_80[1] = 0;
          local_80[4] = 0;
          local_80[5] = 0;
          local_90 = bc_slist_append(local_90,local_80);
        }
        if (cVar1 == '{') {
          local_a8 = current;
        }
        uVar14 = (cVar1 == '{') + 1;
        break;
      case 2:
        if (cVar1 == '%') {
          uVar14 = 4;
        }
        else {
          uVar14 = 1;
          if (cVar1 != '{') break;
          uVar14 = 0x13;
        }
        if (local_b8 <= local_a8 && local_a8 - local_b8 != 0) {
          local_80 = (int *)bc_malloc(0x20);
          *local_80 = local_bc;
          pcVar11 = bc_strndup(src + local_b8,local_a8 - local_b8);
          if (bVar3) {
            pcVar9 = bc_str_lstrip(pcVar11);
            pcVar9 = bc_strdup(pcVar9);
            *(char **)(local_80 + 2) = pcVar9;
            free(pcVar11);
            bVar3 = false;
          }
          else {
            *(char **)(local_80 + 2) = pcVar11;
          }
          local_80[1] = 0;
          local_80[4] = 0;
          local_80[5] = 0;
          local_90 = bc_slist_append(local_90,local_80);
        }
        break;
      case 3:
switchD_00104fce_caseD_3:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 3;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            if (cVar1 == '-') {
              pcVar11 = "Invalid statement syntax. Duplicated whitespace cleaner before statement.";
            }
            else {
              pcVar11 = "Invalid statement syntax. Must begin with lowercase letter.";
            }
            goto LAB_00105a01;
          }
          uVar14 = 5;
          local_b8 = current;
        }
        break;
      case 4:
        if (cVar1 != '-') goto switchD_00104fce_caseD_3;
        uVar14 = 3;
        if ((local_80 != (int *)0x0) && (*local_80 == 0xb)) {
          pcVar11 = bc_str_rstrip(*(char **)(local_80 + 2));
          *(char **)(local_80 + 2) = pcVar11;
        }
        break;
      case 5:
        uVar14 = 5;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          _Var8 = bc_isspace(iVar12);
          if (!_Var8) goto LAB_001052a7;
          lVar13 = current - local_b8;
          if ((lVar13 == 5) && (iVar12 = strncmp("block",src + local_b8,5), iVar12 == 0)) {
            if (!bVar4) {
              local_bc = 8;
              uVar14 = 6;
              local_58 = local_98;
              local_b8 = current;
              bVar6 = bVar5;
              break;
            }
            pcVar11 = "Blocks can\'t be nested.";
            goto LAB_00105a01;
          }
          if ((lVar13 != 8) || (iVar12 = strncmp("endblock",src + local_b8,8), iVar12 != 0)) {
            if ((lVar13 == 5) && (iVar12 = strncmp("ifdef",src + local_b8,5), iVar12 == 0)) {
              local_bc = 1;
LAB_00105c2b:
              local_98 = local_98 + 1;
              uVar14 = 8;
              bVar2 = false;
              local_b8 = current;
            }
            else {
              if (lVar13 == 2) {
                iVar12 = strncmp("if",src + local_b8,2);
                if (iVar12 == 0) {
                  local_bc = 3;
                  goto LAB_00105c2b;
                }
              }
              else if (lVar13 == 4) {
                iVar12 = strncmp("else",src + local_b8,4);
                if (iVar12 == 0) {
                  bVar15 = local_98 == 0;
                  if (bVar4) {
                    bVar15 = local_98 <= local_58;
                  }
                  if (bVar15) {
                    pcVar11 = 
                    "\'else\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement.";
                  }
                  else {
                    if (!bVar2) {
                      local_bc = 4;
                      uVar14 = 0x11;
                      bVar2 = true;
                      break;
                    }
                    pcVar11 = 
                    "More than one \'else\' statement for an open \'if\', \'ifdef\' or \'ifndef\' statement."
                    ;
                  }
                  goto LAB_00105a01;
                }
              }
              else if ((lVar13 == 6) && (iVar12 = strncmp("ifndef",src + local_b8,6), iVar12 == 0))
              {
                local_bc = 2;
                goto LAB_00105c2b;
              }
              if ((lVar13 == 5) && (iVar12 = strncmp("endif",src + local_b8,5), iVar12 == 0)) {
                bVar15 = local_98 == 0;
                if (bVar4) {
                  bVar15 = local_98 <= local_58;
                }
                if (bVar15) {
                  pcVar11 = 
                  "\'endif\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement.";
                  goto LAB_00105a01;
                }
                local_98 = local_98 - 1;
                local_bc = 5;
                uVar14 = 0x11;
                bVar2 = false;
              }
              else if (lVar13 == 10) {
                iVar12 = strncmp("endforeach",src + local_b8,10);
                if (iVar12 != 0) goto LAB_001052a7;
                if (((bVar4) && (bVar6)) || (!bVar5)) {
                  pcVar11 = "\'endforeach\' statement without an open \'foreach\' statement.";
                  goto LAB_00105a01;
                }
                local_bc = 7;
                uVar14 = 0x11;
                bVar5 = false;
              }
              else {
                if ((lVar13 != 7) || (iVar12 = strncmp("foreach",src + local_b8,7), iVar12 != 0)) {
LAB_001052a7:
                  pcVar11 = 
                  "Invalid statement type: Allowed types are: \'block\', \'endblock\', \'if\', \'ifdef\', \'ifndef\', \'else\', \'endif\', \'foreach\' and \'endforeach\'."
                  ;
                  goto LAB_00105a01;
                }
                if (bVar5) {
                  pcVar11 = "\'foreach\' statements can\'t be nested.";
                  goto LAB_00105a01;
                }
                local_bc = 6;
                uVar14 = 0xf;
                bVar5 = true;
                local_b8 = current;
              }
            }
            break;
          }
          if (!bVar4) {
            pcVar11 = "\'endblock\' statement without an open \'block\' statement.";
            goto LAB_00105a01;
          }
          if (local_98 - local_58 == 0) {
            if ((bVar6) || (!bVar5)) {
              bVar4 = false;
              uVar14 = 0x11;
              local_bc = 9;
              break;
            }
            pbVar10 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                          "An open \'foreach\' statement was not closed inside a \'%s\' block!"
                                          ,local_40);
          }
          else {
            pbVar10 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                          "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed inside a \'%s\' block!"
                                          ,local_98 - local_58,local_40);
          }
LAB_00105a08:
          *err = pbVar10;
        }
        break;
      case 6:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 6;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            pcVar11 = "Invalid block syntax. Must begin with lowercase letter.";
            goto LAB_00105a01;
          }
          uVar14 = 7;
          local_b8 = current;
        }
        break;
      case 7:
        uVar14 = 7;
        if (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0x9fU)) {
          _Var8 = bc_isspace(iVar12);
          if (_Var8) {
            lVar13 = current - local_b8;
            switch(lVar13) {
            case 5:
              iVar12 = strncmp("entry",src + local_b8,5);
              if (iVar12 == 0) goto LAB_00105aa4;
              if (lVar13 == 0xd) goto switchD_001055ba_caseD_d;
              if (lVar13 == 0xc) goto switchD_001055ba_caseD_c;
              if (lVar13 == 7) goto switchD_001055ba_caseD_7;
              break;
            case 7:
switchD_001055ba_caseD_7:
              iVar12 = strncmp("listing",src + local_b8,7);
              if (iVar12 == 0) goto LAB_00105aa4;
              if (lVar13 == 0xd) goto switchD_001055ba_caseD_d;
              if (lVar13 == 0xc) goto switchD_001055ba_caseD_c;
              break;
            case 0xc:
switchD_001055ba_caseD_c:
              iVar12 = strncmp("listing_once",src + local_b8,0xc);
              if (iVar12 == 0) {
LAB_00105aa4:
                bVar4 = true;
                uVar14 = 0x11;
                local_a8 = current;
                goto LAB_00105a0b;
              }
              if (lVar13 == 0xd) goto switchD_001055ba_caseD_d;
              break;
            case 0xd:
switchD_001055ba_caseD_d:
              iVar12 = strncmp("listing_empty",src + local_b8,0xd);
              if ((iVar12 == 0) ||
                 (iVar12 = strncmp("listing_entry",src + local_b8,0xd), iVar12 == 0)) {
                uVar14 = 0x11;
                bVar4 = true;
                local_a8 = current;
                goto LAB_00105a0b;
              }
            }
          }
          pcVar11 = 
          "Invalid block type. Allowed types are: \'entry\', \'listing\', \'listing_once\', \'listing_empty\' and \'listing_entry\'."
          ;
LAB_00105a01:
          pbVar10 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar11);
          goto LAB_00105a08;
        }
        break;
      case 8:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 8;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
LAB_001057a6:
            pcVar11 = "Invalid variable name. Must begin with uppercase letter.";
            goto LAB_00105a01;
          }
          uVar14 = 9;
          local_b8 = current;
        }
        break;
      case 9:
        uVar14 = 9;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var8 = bc_isspace(iVar12);
          if (!_Var8) {
LAB_001059ec:
            pcVar11 = "Invalid variable name. Must be uppercase letter, number or \'_\'.";
            goto LAB_00105a01;
          }
          uVar14 = 0x11;
          local_a8 = current;
          if (local_bc == 3) {
            uVar14 = 10;
          }
        }
        break;
      case 10:
        _Var8 = bc_isspace(iVar12);
        if (!_Var8) {
          local_68 = current;
        }
        uVar14 = _Var8 ^ 0xb;
        break;
      case 0xb:
        _Var8 = bc_isspace(iVar12);
        if (_Var8) {
          local_70 = current;
        }
        uVar14 = _Var8 + 0xb;
        break;
      case 0xc:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 0xc;
        if (!_Var8) {
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            uVar14 = 0xe;
            local_60 = current;
          }
          else if (cVar1 == '\"') {
            uVar14 = 0xd;
            local_60 = current;
          }
          else {
            pbVar10 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                      "Invalid \'if\' operand. Must be double-quoted static string or variable."
                                     );
            *err = pbVar10;
LAB_00105ceb:
            local_68 = 0;
            local_70 = 0;
          }
        }
        break;
      case 0xd:
        uVar14 = 0xd;
        if (cVar1 == '\"') {
          if (src[current - 1] != '\\') {
            local_78 = current + 1;
          }
          uVar14 = (uint)(src[current - 1] != '\\') * 4 + 0xd;
        }
        break;
      case 0xe:
        uVar14 = 0xe;
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          bVar15 = 9 < (byte)(cVar1 - 0x30U);
          if (cVar1 != '_' && bVar15) {
            local_78 = current;
          }
          bVar15 = cVar1 != '_' && bVar15;
          uVar14 = (uint)bVar15 + (uint)bVar15 * 2 + 0xe;
        }
        break;
      case 0xf:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 0xf;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            pcVar11 = "Invalid foreach variable name. Must begin with uppercase letter.";
            goto LAB_00105a01;
          }
          uVar14 = 0x10;
          local_b8 = current;
        }
        break;
      case 0x10:
        uVar14 = 0x10;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var8 = bc_isspace(iVar12);
          if (!_Var8) {
            pcVar11 = "Invalid foreach variable name. Must be uppercase letter, number or \'_\'.";
            goto LAB_00105a01;
          }
          uVar14 = 0x11;
          local_a8 = current;
        }
        break;
      case 0x11:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 0x11;
        if (!_Var8) {
          if (cVar1 == '%') goto LAB_001057df;
          if (cVar1 != '-') goto LAB_0010544d;
          uVar14 = 0x12;
          bVar3 = true;
        }
        break;
      case 0x12:
        if (cVar1 == '-') {
          pcVar11 = "Invalid statement syntax. Duplicated whitespace cleaner after statement.";
        }
        else {
          if (cVar1 == '%') goto LAB_001057df;
LAB_0010544d:
          pcVar11 = "Invalid statement syntax. Must end with \'%%}\'.";
        }
        pbVar10 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,pcVar11);
        *err = pbVar10;
        uVar14 = 0x12;
        break;
      case 0x13:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 0x13;
        if (!_Var8) {
          if (0x19 < (byte)(cVar1 + 0xbfU)) goto LAB_001057a6;
          local_bc = 10;
          uVar14 = 0x14;
          local_b8 = current;
        }
        break;
      case 0x14:
        uVar14 = 0x14;
        if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 9 < (byte)(cVar1 - 0x30U))) {
          _Var8 = bc_isspace(iVar12);
          if (!_Var8) {
            uVar7 = current;
            if (cVar1 != '}') goto LAB_001059ec;
            goto LAB_001057df;
          }
          uVar14 = 0x15;
          local_a8 = current;
        }
        break;
      case 0x15:
        _Var8 = bc_isspace(iVar12);
        uVar14 = 0x15;
        if (!_Var8) {
          if (cVar1 != '}') {
            pcVar11 = "Invalid statement syntax. Must end with \'}}\'.";
            goto LAB_00105a01;
          }
LAB_001057df:
          local_a8 = uVar7;
          uVar14 = 0x16;
        }
        break;
      case 0x16:
        if (cVar1 != '}') {
          pbVar10 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,current,
                                    "Invalid statement syntax. Must end with \'}\'.");
          *err = pbVar10;
          goto LAB_001057df;
        }
        uVar14 = 0;
        if (local_68 < local_70) {
          if (local_70 - local_68 == 2) {
            pcVar11 = src + local_68;
            iVar12 = strncmp("<=",pcVar11,2);
            if (iVar12 == 0) {
              uVar14 = 6;
            }
            else {
              iVar12 = strncmp(">=",pcVar11,2);
              if (iVar12 == 0) {
                uVar14 = 10;
              }
              else {
                iVar12 = strncmp("==",pcVar11,2);
                if (iVar12 != 0) {
                  iVar12 = strncmp("!=",pcVar11,2);
                  bVar15 = iVar12 != 0;
                  uVar14 = (uint)(iVar12 == 0);
                  goto LAB_00105cc2;
                }
                uVar14 = 2;
              }
            }
LAB_00105cc0:
            bVar15 = false;
          }
          else if (local_70 - local_68 == 1) {
            cVar1 = src[local_68];
            if (cVar1 == '<') {
              uVar14 = 4;
              goto LAB_00105cc0;
            }
            bVar15 = cVar1 != '>';
            uVar14 = (uint)(cVar1 == '>') << 3;
          }
          else {
            uVar14 = 0;
            bVar15 = true;
          }
LAB_00105cc2:
          if (bVar15) {
            pbVar10 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,local_68,
                                      "Invalid \'if\' operator. Must be \'<\', \'>\', \'<=\', \'>=\', \'==\' or \'!=\'."
                                     );
            *err = pbVar10;
            uVar14 = 0x16;
            goto LAB_00105ceb;
          }
          local_68 = 0;
          local_70 = 0;
        }
        local_80 = (int *)bc_malloc(0x20);
        *local_80 = local_bc;
        local_80[1] = uVar14;
        local_80[2] = 0;
        local_80[3] = 0;
        local_80[4] = 0;
        local_80[5] = 0;
        if (local_b8 <= local_a8 && local_a8 - local_b8 != 0) {
          pcVar11 = bc_strndup(src + local_b8,local_a8 - local_b8);
          *(char **)(local_80 + 2) = pcVar11;
        }
        if (local_60 <= local_78 && local_78 - local_60 != 0) {
          pcVar11 = bc_strndup(src + local_60,local_78 - local_60);
          *(char **)(local_80 + 4) = pcVar11;
          local_60 = 0;
          local_78 = 0;
        }
        if (local_bc == 8) {
          local_40 = *(undefined8 *)(local_80 + 2);
        }
        local_90 = bc_slist_append(local_90,local_80);
        local_bc = 0xb;
        uVar14 = 1;
        local_b8 = current + 1;
      }
    }
LAB_00105a0b:
    current = current + 1;
  } while (*err == (bc_error_t *)0x0);
  if (*err == (bc_error_t *)0x0) {
    if (uVar14 == 0xd) {
      pbVar10 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,local_60,
                                "Found an open double-quoted string.");
    }
    else if (local_98 == 0) {
      if (bVar4) {
        pcVar11 = "An open block was not closed!";
      }
      else {
        if (!bVar5) goto LAB_00105f35;
        pcVar11 = "An open \'foreach\' statement was not closed!";
      }
      pbVar10 = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,pcVar11);
    }
    else {
      pbVar10 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed!"
                                   );
    }
    *err = pbVar10;
  }
LAB_00105f35:
  if (*err != (bc_error_t *)0x0) {
    blogc_template_free_ast(local_90);
    return (bc_slist_t *)0x0;
  }
  return local_90;
}

Assistant:

bc_slist_t*
blogc_template_parse(const char *src, size_t src_len, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end = 0;
    size_t op_start = 0;
    size_t op_end = 0;
    size_t start2 = 0;
    size_t end2 = 0;

    blogc_template_operator_t tmp_op = 0;

    size_t if_count = 0;
    size_t block_if_count = 0;
    bool else_open = false;
    bool foreach_open = false;
    bool block_foreach_open = false;

    bc_slist_t *ast = NULL;
    blogc_template_node_t *node = NULL;

    /*
     * this is a reference to the content of previous node in the singly-linked
     * list. The "correct" solution here would be implement a doubly-linked
     * list, but here are a few reasons to avoid it:
     *
     * - i'm too tired to implement it :P
     * - template parser never walk backwards, then the list itself does not
     *   need to know its previous node.
     */
    blogc_template_node_t *previous = NULL;

    bool lstrip_next = false;
    char *tmp = NULL;
    char *block_type = NULL;

    blogc_template_parser_state_t state = TEMPLATE_START;
    blogc_template_node_type_t type = BLOGC_TEMPLATE_NODE_CONTENT;

    bool block_open = false;

    while (current < src_len) {
        char c = src[current];
        bool last = current == src_len - 1;

        switch (state) {

            case TEMPLATE_START:
                if (last) {
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    if (lstrip_next) {
                        tmp = bc_strndup(src + start, src_len - start);
                        node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                        free(tmp);
                        tmp = NULL;
                        lstrip_next = false;
                    }
                    else {
                        node->data[0] = bc_strndup(src + start, src_len - start);
                    }
                    node->op = 0;
                    node->data[1] = NULL;
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                }
                if (c == '{') {
                    end = current;
                    state = TEMPLATE_OPEN_BRACKET;
                }
                break;

            case TEMPLATE_OPEN_BRACKET:
                if (c == '%' || c == '{') {
                    if (c == '%')
                        state = TEMPLATE_BLOCK_START_WHITESPACE_CLEANER;
                    else
                        state = TEMPLATE_VARIABLE_START;
                    if (end > start) {
                        node = bc_malloc(sizeof(blogc_template_node_t));
                        node->type = type;
                        if (lstrip_next) {
                            tmp = bc_strndup(src + start, end - start);
                            node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                            free(tmp);
                            tmp = NULL;
                            lstrip_next = false;
                        }
                        else {
                            node->data[0] = bc_strndup(src + start, end - start);
                        }
                        node->op = 0;
                        node->data[1] = NULL;
                        ast = bc_slist_append(ast, node);
                        previous = node;
                        node = NULL;
                    }
                    break;
                }
                state = TEMPLATE_START;
                break;

            case TEMPLATE_BLOCK_START_WHITESPACE_CLEANER:
                if (c == '-') {
                    if ((previous != NULL) &&
                        (previous->type == BLOGC_TEMPLATE_NODE_CONTENT))
                    {
                        previous->data[0] = bc_str_rstrip(previous->data[0]);  // does not need copy
                    }
                    state = TEMPLATE_BLOCK_START;
                    break;
                }
                state = TEMPLATE_BLOCK_START;

            case TEMPLATE_BLOCK_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_TYPE;
                    start = current;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner before statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_TYPE:
                if (c >= 'a' && c <= 'z')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("block", src + start, 5)))
                    {
                        if (!block_open) {
                            state = TEMPLATE_BLOCK_BLOCK_TYPE_START;
                            type = BLOGC_TEMPLATE_NODE_BLOCK;
                            start = current;
                            block_if_count = if_count;
                            block_foreach_open = foreach_open;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "Blocks can't be nested.");
                        break;
                    }
                    else if ((current - start == 8) &&
                        (0 == strncmp("endblock", src + start, 8)))
                    {
                        if (block_open) {
                            if (if_count != block_if_count) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "%d open 'if', 'ifdef' and/or 'ifndef' statements "
                                    "were not closed inside a '%s' block!",
                                    if_count - block_if_count, block_type);
                                break;
                            }
                            if (!block_foreach_open && foreach_open) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "An open 'foreach' statement was not closed "
                                    "inside a '%s' block!", block_type);
                                break;
                            }
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDBLOCK;
                            block_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endblock' statement without an open 'block' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("ifdef", src + start, 5)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 6) &&
                        (0 == strncmp("ifndef", src + start, 6)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFNDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 2) &&
                        (0 == strncmp("if", src + start, 2)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 4) &&
                        (0 == strncmp("else", src + start, 4)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            if (!else_open) {
                                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                                type = BLOGC_TEMPLATE_NODE_ELSE;
                                else_open = true;
                                break;
                            }
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, current,
                                "More than one 'else' statement for an open 'if', "
                                "'ifdef' or 'ifndef' statement.");
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'else' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("endif", src + start, 5)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDIF;
                            if_count--;
                            else_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endif' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("foreach", src + start, 7)))
                    {
                        if (!foreach_open) {
                            state = TEMPLATE_BLOCK_FOREACH_START;
                            type = BLOGC_TEMPLATE_NODE_FOREACH;
                            start = current;
                            foreach_open = true;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "'foreach' statements can't "
                            "be nested.");
                        break;
                    }
                    else if ((current - start == 10) &&
                        (0 == strncmp("endforeach", src + start, 10)))
                    {
                        if ((block_open && !block_foreach_open && foreach_open) ||
                            (!block_open && foreach_open))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDFOREACH;
                            foreach_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endforeach' statement without an open 'foreach' "
                            "statement.");
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement type: Allowed types are: 'block', "
                    "'endblock', 'if', 'ifdef', 'ifndef', 'else', 'endif', "
                    "'foreach' and 'endforeach'.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_BLOCK_TYPE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE:
                if ((c >= 'a' && c <= 'z') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("entry", src + start, 5)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("listing", src + start, 7)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 12) &&
                        (0 == strncmp("listing_once", src + start, 12)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_empty", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_entry", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block type. Allowed types are: 'entry', 'listing', "
                    "'listing_once', 'listing_empty' and 'listing_entry'.");
                break;

            case TEMPLATE_BLOCK_IF_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_BLOCK_IF_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    if (type == BLOGC_TEMPLATE_NODE_IF)
                        state = TEMPLATE_BLOCK_IF_OPERATOR_START;
                    else
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR_START:
                if (bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERATOR;
                op_start = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR:
                if (!bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERAND_START;
                op_end = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERAND_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE_OPERAND;
                    start2 = current;
                    break;
                }
                if (c == '"') {
                    state = TEMPLATE_BLOCK_IF_STRING_OPERAND;
                    start2 = current;
                    break;
                }
                op_start = 0;
                op_end = 0;
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid 'if' operand. Must be double-quoted static "
                    "string or variable.");
                break;

            case TEMPLATE_BLOCK_IF_STRING_OPERAND:
                if (c != '"')
                    break;
                if (c == '"' && src[current - 1] == '\\')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current + 1;
                break;

           case TEMPLATE_BLOCK_IF_VARIABLE_OPERAND:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current;
                break;

            case TEMPLATE_BLOCK_FOREACH_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_FOREACH_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must begin with uppercase "
                    "letter.");
                break;

            case TEMPLATE_BLOCK_FOREACH_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must be uppercase letter, "
                    "number or '_'.");
                break;

            case TEMPLATE_BLOCK_END_WHITESPACE_CLEANER:
                if (bc_isspace(c))
                    break;
                if (c == '-') {
                    lstrip_next = true;
                    state = TEMPLATE_BLOCK_END;
                    break;
                }
                state = TEMPLATE_BLOCK_END;

            case TEMPLATE_BLOCK_END:
                if (c == '%') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner after statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '%%}'.");
                break;

            case TEMPLATE_VARIABLE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_VARIABLE;
                    type = BLOGC_TEMPLATE_NODE_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_VARIABLE_END;
                    break;
                }
                if (c == '}') {
                    end = current;
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_VARIABLE_END:
                if (bc_isspace(c))
                    break;
                if (c == '}') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}}'.");
                break;

            case TEMPLATE_CLOSE_BRACKET:
                if (c == '}') {
                    tmp_op = 0;
                    if (op_end > op_start) {
                        if (op_end - op_start == 1) {
                            if (0 == strncmp("<", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_LT;
                            else if (0 == strncmp(">", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_GT;
                        }
                        else if (op_end - op_start == 2) {
                            if (0 == strncmp("<=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_LT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp(">=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_GT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("==", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("!=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_NEQ;
                        }
                        if (tmp_op == 0) {
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, op_start,
                                "Invalid 'if' operator. Must be '<', '>', "
                                "'<=', '>=', '==' or '!='.");
                            op_start = 0;
                            op_end = 0;
                            break;
                        }
                        op_start = 0;
                        op_end = 0;
                    }
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    node->op = tmp_op;
                    node->data[0] = NULL;
                    node->data[1] = NULL;
                    if (end > start)
                        node->data[0] = bc_strndup(src + start, end - start);
                    if (end2 > start2) {
                        node->data[1] = bc_strndup(src + start2, end2 - start2);
                        start2 = 0;
                        end2 = 0;
                    }
                    if (type == BLOGC_TEMPLATE_NODE_BLOCK)
                        block_type = node->data[0];
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                    state = TEMPLATE_START;
                    type = BLOGC_TEMPLATE_NODE_CONTENT;
                    start = current + 1;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}'.");
                break;

        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL) {
        if (state == TEMPLATE_BLOCK_IF_STRING_OPERAND)
            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src, src_len,
                start2, "Found an open double-quoted string.");
        else if (if_count != 0)
            *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                "%d open 'if', 'ifdef' and/or 'ifndef' statements were not closed!",
                if_count);
        else if (block_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open block was not closed!");
        else if (foreach_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open 'foreach' statement was not closed!");
    }

    if (*err != NULL) {
        if (node != NULL) {
            free(node->data[0]);
            free(node);
        }
        blogc_template_free_ast(ast);
        return NULL;
    }

    return ast;
}